

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O2

Carver * __thiscall carver::Carver::carveImage(Carver *this)

{
  CarveMode CVar1;
  out_of_range *this_00;
  pointer p_Var2;
  _Result<std::vector<int,_std::allocator<int>_>_> *p_Var3;
  Carver *pCVar4;
  int iVar5;
  _State_baseV2 *__tmp;
  int __val;
  Carver *in_RSI;
  Mat *pMVar6;
  _Vector_base<int,_std::allocator<int>_> *in_R8;
  int iVar7;
  _State_baseV2 *__tmp_1;
  int local_2cc;
  __allocator_type __a2_3;
  __allocator_type __a2_2;
  string local_2b8;
  vector<int,_std::allocator<int>_> verticalSeam;
  future<std::vector<int,_std::allocator<int>_>_> horizontalSeamFuture;
  undefined1 local_268 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [5];
  Carver *local_208;
  __allocator_type __a2;
  int iStack_1fc;
  string local_1f8;
  vector<int,_std::allocator<int>_> horizontalSeam;
  future<std::vector<int,_std::allocator<int>_>_> verticalSeamFuture;
  Mat energyMap;
  _Vector_base<int,_std::allocator<int>_> local_130;
  string local_118;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  _Vector_base<int,_std::allocator<int>_> local_e0;
  Mat grayscale;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  CVar1 = in_RSI->carveMode_;
  iVar7 = in_RSI->carveCount_;
  local_208 = in_RSI;
  if (iVar7 == 0) {
    iVar7 = 0;
    __val = 0;
    if ((CVar1 & ~BOTH) == VERTICAL) {
      __val = (int)((float)in_RSI->imageCols_ * in_RSI->carveAmount_);
    }
    in_RSI->vIterations_ = __val;
    if (CVar1 - HORIZONTAL < 2) {
      iVar7 = (int)((float)in_RSI->imageRows_ * in_RSI->carveAmount_);
    }
    in_RSI->hIterations_ = iVar7;
  }
  else {
    __val = 0;
    if ((CVar1 & ~BOTH) == VERTICAL) {
      __val = iVar7;
    }
    iVar5 = 0;
    if (CVar1 - HORIZONTAL < 2) {
      iVar5 = iVar7;
    }
    in_RSI->vIterations_ = __val;
    in_RSI->hIterations_ = iVar5;
    if ((in_RSI->imageRows_ <= iVar5) || (in_RSI->imageCols_ <= __val)) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_2b8,in_RSI->carveCount_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &horizontalSeam,"Number of pixels to carve ",&local_2b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &verticalSeam,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &horizontalSeam," out of range for image of size ");
      std::__cxx11::to_string(&local_1f8,local_208->imageCols_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &verticalSeam,&local_1f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&energyMap
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268
                     ,"x");
      std::__cxx11::to_string((string *)&verticalSeamFuture,local_208->imageRows_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&grayscale
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &energyMap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &verticalSeamFuture);
      std::out_of_range::out_of_range(this_00,(string *)&grayscale);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  std::__cxx11::to_string((string *)&verticalSeam,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 "Removing ",(string *)&verticalSeam);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&energyMap,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 " columns and ");
  std::__cxx11::to_string((string *)&horizontalSeam,in_RSI->hIterations_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&grayscale,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&energyMap,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &horizontalSeam);
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&grayscale,
                 " rows");
  log_(in_RSI,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&grayscale);
  std::__cxx11::string::~string((string *)&horizontalSeam);
  std::__cxx11::string::~string((string *)&energyMap);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)&verticalSeam);
  cv::Mat::Mat(&grayscale);
  cv::Mat::Mat(&energyMap);
  cv::Mat::Mat(&this->originalImage_,&in_RSI->originalImage_);
  iVar7 = 0;
  local_2cc = 0;
  do {
    if ((in_RSI->vIterations_ <= iVar7) && (in_RSI->hIterations_ <= local_2cc)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"",(allocator<char> *)local_268);
      log_(in_RSI,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      cv::Mat::~Mat(&energyMap);
      cv::Mat::~Mat(&grayscale);
      return this;
    }
    local_258[0]._M_allocated_capacity = 0;
    verticalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_268._0_4_ = 0x1010000;
    verticalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(verticalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,0x2010000);
    verticalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&grayscale;
    _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    cv::cvtColor((cv *)local_268,(_InputArray *)&verticalSeam,(_OutputArray *)0x6,0,(int)in_R8);
    calculateEnergy((Carver *)local_268,&in_RSI->originalImage_);
    cv::Mat::operator=(&energyMap,(Mat *)local_268);
    cv::Mat::~Mat((Mat *)local_268);
    if (local_2cc < in_RSI->hIterations_ && iVar7 < in_RSI->vIterations_) {
      verticalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      verticalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      verticalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      horizontalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      horizontalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      horizontalSeam.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_2b8._M_dataplus._M_p = (pointer)0x0;
      local_2b8._M_string_length = 0;
      p_Var2 = (pointer)operator_new(0x58);
      local_268 = (undefined1  [8])&__a2;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00112618;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00112668;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
      p_Var3 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
      std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var3);
      *(_Result<std::vector<int,_std::allocator<int>_>_> **)
       ((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
      *(Carver **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x38) = in_RSI;
      *(Mat **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x40) = &energyMap;
      ___a2_3 = (long *)0x0;
      horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x20);
      (horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr__State_baseV2 = (_func_int **)&PTR___State_001126c0;
      ((horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_result)._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
           (_Result_base *)&p_Var2->_M_impl;
      *(code **)&(horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>
                  ._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_M_status =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>
           ::_M_run;
      *(undefined8 *)
       &(horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>._M_state
         .super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_M_once = 0;
      std::thread::_M_start_thread(&__a2_3,&horizontalSeamFuture,0);
      if (horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>.
          _M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        (*(horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>.
           _M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr__State_baseV2[1])();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20),(thread *)&__a2_3
                );
      std::thread::~thread((thread *)&__a2_3);
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)local_268);
      local_1f8._M_dataplus._M_p = (pointer)0x0;
      local_1f8._M_string_length = 0;
      local_268 = (undefined1  [8])local_2b8._M_dataplus._M_p;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length;
      local_2b8._M_dataplus._M_p = (pointer)&p_Var2->_M_impl;
      local_2b8._M_string_length = (size_type)p_Var2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
      if (local_2b8._M_dataplus._M_p == (pointer)0x0) {
        p_Var2 = (pointer)operator_new(0x48);
        local_268 = (undefined1  [8])&horizontalSeamFuture;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00112700;
        *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00112750;
        _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
        p_Var3 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
        std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var3);
        *(_Result<std::vector<int,_std::allocator<int>_>_> **)
         ((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
        *(Carver **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = in_RSI;
        *(Mat **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = &energyMap;
        _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)local_268);
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        local_1f8._M_string_length = 0;
        local_268 = (undefined1  [8])local_2b8._M_dataplus._M_p;
        _Stack_260._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length;
        local_2b8._M_dataplus._M_p = (pointer)&p_Var2->_M_impl;
        local_2b8._M_string_length = (size_type)p_Var2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
      }
      std::__basic_future<std::vector<int,_std::allocator<int>_>_>::__basic_future
                (&verticalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>,
                 (__state_type *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
      local_2b8._M_dataplus._M_p = (pointer)0x0;
      local_2b8._M_string_length = 0;
      pCVar4 = (Carver *)operator_new(0x58);
      local_268 = (undefined1  [8])&__a2_2;
      *(undefined8 *)&pCVar4->field_0x8 = 0x100000001;
      *(undefined ***)pCVar4 = &PTR___Sp_counted_ptr_inplace_00112798;
      *(undefined8 *)&pCVar4->field_0x18 = 0;
      *(undefined4 *)&pCVar4->field_0x20 = 0;
      pCVar4->field_0x24 = 0;
      *(undefined4 *)&pCVar4->field_0x28 = 0;
      *(undefined8 *)&pCVar4->field_0x30 = 0;
      *(undefined4 *)&pCVar4->field_0x38 = 0;
      *(undefined ***)&pCVar4->field_0x10 = &PTR___Async_state_impl_001127e8;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar4;
      p_Var3 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
      std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var3);
      *(_Result<std::vector<int,_std::allocator<int>_>_> **)&pCVar4->field_0x40 = p_Var3;
      *(Carver **)&pCVar4->field_0x48 = in_RSI;
      *(Mat **)&pCVar4->field_0x50 = &energyMap;
      ___a2 = 0.0;
      iStack_1fc = 0;
      ___a2_3 = (long *)operator_new(0x20);
      *___a2_3 = (long)&PTR___State_00112840;
      ___a2_3[1] = (long)&pCVar4->field_0x10;
      ___a2_3[2] = (long)std::__future_base::
                         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>
                         ::_M_run;
      ___a2_3[3] = 0;
      std::thread::_M_start_thread(&__a2,&__a2_3,0);
      if (___a2_3 != (long *)0x0) {
        (**(code **)(*___a2_3 + 8))();
      }
      std::thread::operator=((thread *)&pCVar4->field_0x30,(thread *)&__a2);
      std::thread::~thread((thread *)&__a2);
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)local_268);
      local_1f8._M_dataplus._M_p = (pointer)0x0;
      local_1f8._M_string_length = 0;
      local_268 = (undefined1  [8])local_2b8._M_dataplus._M_p;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length;
      local_2b8._M_dataplus._M_p = &pCVar4->field_0x10;
      local_2b8._M_string_length = (size_type)pCVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
      in_RSI = local_208;
      if (local_2b8._M_dataplus._M_p == (pointer)0x0) {
        pCVar4 = (Carver *)operator_new(0x48);
        local_268 = (undefined1  [8])&__a2_3;
        *(undefined8 *)&pCVar4->field_0x8 = 0x100000001;
        *(undefined ***)pCVar4 = &PTR___Sp_counted_ptr_inplace_00112880;
        *(undefined8 *)&pCVar4->field_0x18 = 0;
        *(undefined4 *)&pCVar4->field_0x20 = 0;
        pCVar4->field_0x24 = 0;
        *(undefined4 *)&pCVar4->field_0x28 = 0;
        *(undefined ***)&pCVar4->field_0x10 = &PTR___Deferred_state_001128d0;
        _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar4;
        p_Var3 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
        std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var3);
        *(_Result<std::vector<int,_std::allocator<int>_>_> **)&pCVar4->field_0x30 = p_Var3;
        *(Carver **)&pCVar4->field_0x38 = in_RSI;
        *(Mat **)&pCVar4->field_0x40 = &energyMap;
        _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jjstoo[P]seam_carver_src_carver_cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)local_268);
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        local_1f8._M_string_length = 0;
        local_268 = (undefined1  [8])local_2b8._M_dataplus._M_p;
        _Stack_260._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length;
        local_2b8._M_dataplus._M_p = &pCVar4->field_0x10;
        local_2b8._M_string_length = (size_type)pCVar4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
      }
      std::__basic_future<std::vector<int,_std::allocator<int>_>_>::__basic_future
                (&horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>
                 ,(__state_type *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((vector<int,_std::allocator<int>_> *)local_268,&verticalSeamFuture);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                (&verticalSeam,(_Vector_base<int,_std::allocator<int>_> *)local_268);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_268);
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((vector<int,_std::allocator<int>_> *)local_268,&horizontalSeamFuture);
      pMVar6 = (Mat *)&horizontalSeam;
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)pMVar6,
                 (_Vector_base<int,_std::allocator<int>_> *)local_268);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_268);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_130,&verticalSeam);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_48,
                 (vector<int,_std::allocator<int>_> *)pMVar6);
      in_R8 = &local_48;
      removeSeams((Carver *)local_268,pMVar6,(vector<int,_std::allocator<int>_> *)this,
                  (vector<int,_std::allocator<int>_> *)&local_130);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_268);
      cv::Mat::~Mat((Mat *)local_268);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_130);
      iVar7 = iVar7 + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&horizontalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>
                  ._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&verticalSeamFuture.super___basic_future<std::vector<int,_std::allocator<int>_>_>.
                  _M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&horizontalSeam.super__Vector_base<int,_std::allocator<int>_>);
LAB_0010a50c:
      local_2cc = local_2cc + 1;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&verticalSeam.super__Vector_base<int,_std::allocator<int>_>);
    }
    else if (iVar7 < in_RSI->vIterations_) {
      pMVar6 = (Mat *)&verticalSeam;
      getSeamToRemove((vector<int,_std::allocator<int>_> *)pMVar6,in_RSI,&energyMap,VERTICAL);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_e0,
                 (vector<int,_std::allocator<int>_> *)pMVar6);
      removeVerticalSeam((Carver *)local_268,pMVar6,(vector<int,_std::allocator<int>_> *)this);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_268);
      cv::Mat::~Mat((Mat *)local_268);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e0);
      iVar7 = iVar7 + 1;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&verticalSeam.super__Vector_base<int,_std::allocator<int>_>);
    }
    else if (local_2cc < in_RSI->hIterations_) {
      pMVar6 = (Mat *)&verticalSeam;
      getSeamToRemove((vector<int,_std::allocator<int>_> *)pMVar6,in_RSI,&energyMap,HORIZONTAL);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_f8,
                 (vector<int,_std::allocator<int>_> *)pMVar6);
      removeHorizontalSeam((Carver *)local_268,pMVar6,(vector<int,_std::allocator<int>_> *)this);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_268);
      cv::Mat::~Mat((Mat *)local_268);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
      goto LAB_0010a50c;
    }
    printStatus_(in_RSI,local_2cc,iVar7);
  } while( true );
}

Assistant:

cv::Mat Carver::carveImage() {
    // Set the iteration counters and max values
    int v = 0;
    int h = 0;

    if (!carveCount_) {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    static_cast<int>(imageCols_ * carveAmount_) : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    static_cast<int>(imageRows_ * carveAmount_): 0;
    } else {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    carveCount_ : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    carveCount_ : 0;

        if (!(hIterations_ < imageRows_) || !(vIterations_ < imageCols_))
            throw (out_of_range("Number of pixels to carve " +
                                to_string(carveCount_) +
                                " out of range for image of size " +
                                to_string(imageCols_) + "x" +
                                to_string(imageRows_)));
    }


    log_("Removing " + to_string(vIterations_) + " columns and " +
        to_string(hIterations_) + " rows");

    cv::Mat grayscale;
    cv::Mat energyMap;
    cv::Mat target = originalImage_;

    while(v < vIterations_ || h < hIterations_) {
        cv::cvtColor(target, grayscale, cv::COLOR_BGR2GRAY);
        energyMap = calculateEnergy(grayscale);
        if (v < vIterations_ && h < hIterations_) {
            vector<int> verticalSeam;
            vector<int> horizontalSeam;

            #ifdef CONCURRENT
            // Invoke asynchronous processing for seam pathfinding
            auto verticalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, VERTICAL);
                    });
            auto horizontalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, HORIZONTAL);
                    });

            // Synchronize
            verticalSeam = verticalSeamFuture.get();
            horizontalSeam = horizontalSeamFuture.get();

            #else
            verticalSeam = getSeamToRemove(energyMap, VERTICAL);
            horizontalSeam = getSeamToRemove(energyMap, HORIZONTAL);
            #endif

            target = removeSeams(target, verticalSeam, horizontalSeam);
            v++;
            h++;
        } else if (v < vIterations_) {
            vector<int> verticalSeam =
                    getSeamToRemove(energyMap, VERTICAL);
            target = removeVerticalSeam(target, verticalSeam);
            v++;
        } else if (h < hIterations_) {
            vector<int> horizontalSeam =
                    getSeamToRemove(energyMap, HORIZONTAL);
            target = removeHorizontalSeam(target, horizontalSeam);
            h++;
        }
        printStatus_(h, v);
    }
    log_("");
    return target;
}